

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_8873c5::TransformSelectorAt::Validate(TransformSelectorAt *this,size_t count)

{
  bool bVar1;
  vector<long,_std::allocator<long>_> *this_00;
  reference plVar2;
  index_type local_58;
  index_type local_50;
  long index;
  iterator __end2;
  iterator __begin2;
  vector<long,_std::allocator<long>_> *__range2;
  vector<long,_std::allocator<long>_> indexes;
  size_t count_local;
  TransformSelectorAt *this_local;
  
  indexes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)count;
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)&__range2)
  ;
  this_00 = &(this->super_TransformSelectorIndexes).Indexes;
  __end2 = std::vector<long,_std::allocator<long>_>::begin(this_00);
  index = (long)std::vector<long,_std::allocator<long>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                *)&index);
    if (!bVar1) break;
    plVar2 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator*(&__end2);
    local_50 = *plVar2;
    local_58 = TransformSelectorIndexes::NormalizeIndex
                         (&this->super_TransformSelectorIndexes,local_50,
                          (size_t)indexes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage);
    std::vector<long,_std::allocator<long>_>::push_back
              ((vector<long,_std::allocator<long>_> *)&__range2,&local_58);
    __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
              (&__end2);
  }
  std::vector<long,_std::allocator<long>_>::operator=
            (&(this->super_TransformSelectorIndexes).Indexes,
             (vector<long,_std::allocator<long>_> *)&__range2);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)&__range2);
  return true;
}

Assistant:

bool Validate(std::size_t count) override
  {
    decltype(this->Indexes) indexes;

    for (auto index : this->Indexes) {
      indexes.push_back(this->NormalizeIndex(index, count));
    }
    this->Indexes = std::move(indexes);

    return true;
  }